

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O0

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  uint uVar1;
  PS_UniMap *pPStack_40;
  FT_UInt32 base_glyph;
  PS_UniMap *mid;
  PS_UniMap *max;
  PS_UniMap *min;
  PS_UniMap *result;
  FT_UInt32 unicode_local;
  PS_Unicodes table_local;
  
  min = (PS_UniMap *)0x0;
  max = table->maps;
  mid = max + table->num_maps;
  pPStack_40 = max + ((long)mid - (long)max >> 4);
  do {
    if (mid <= max) {
LAB_0031b931:
      if (min == (PS_UniMap *)0x0) {
        table_local._4_4_ = 0;
      }
      else {
        table_local._4_4_ = min->glyph_index;
      }
      return table_local._4_4_;
    }
    if (pPStack_40->unicode == unicode) {
      min = pPStack_40;
      goto LAB_0031b931;
    }
    uVar1 = pPStack_40->unicode & 0x7fffffff;
    if (uVar1 == unicode) {
      min = pPStack_40;
    }
    if (uVar1 < unicode) {
      max = pPStack_40 + 1;
    }
    else {
      mid = pPStack_40;
    }
    pPStack_40 = pPStack_40 + (unicode - uVar1);
    if ((mid <= pPStack_40) || (pPStack_40 < max)) {
      pPStack_40 = max + ((long)mid - (long)max >> 4);
    }
  } while( true );
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *result = NULL;
    PS_UniMap  *min = table->maps;
    PS_UniMap  *max = min + table->num_maps;
    PS_UniMap  *mid = min + ( ( max - min ) >> 1 );


    /* Perform a binary search on the table. */
    while ( min < max )
    {
      FT_UInt32  base_glyph;


      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid;

      /* reasonable prediction in a continuous block */
      mid += unicode - base_glyph;
      if ( mid >= max || mid < min )
        mid = min + ( ( max - min ) >> 1 );
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }